

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O3

void __thiscall Storage::Tape::ZX8081::Parser::process_pulse(Parser *this,Pulse *pulse)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = pulse->type == High;
  bVar1 = this->pulse_was_high_;
  this->pulse_was_high_ = bVar2;
  if ((bVar2) && (bVar1 != bVar2)) {
    post_pulse(this);
    this->pulse_time_ = pulse->length;
    return;
  }
  Time::operator+=(&this->pulse_time_,&pulse->length);
  return;
}

Assistant:

void Parser::process_pulse(const Storage::Tape::Tape::Pulse &pulse) {
	// If this is anything other than a transition from low to high, just add it to the
	// count of time.
	const bool pulse_is_high = pulse.type == Storage::Tape::Tape::Pulse::High;
	const bool pulse_did_change = pulse_is_high != pulse_was_high_;
	pulse_was_high_ = pulse_is_high;
	if(!pulse_did_change || !pulse_is_high) {
		pulse_time_ += pulse.length;
		return;
	}

	// Otherwise post a new pulse.
	post_pulse();
	pulse_time_ = pulse.length;
}